

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

uint32_t ExtraCostCombined_C(uint32_t *X,uint32_t *Y,int length)

{
  uint32_t uVar1;
  long lVar2;
  
  uVar1 = Y[4] + X[4] + X[5] + Y[5];
  for (lVar2 = 2; lVar2 < length / 2 + -1; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 + (int)lVar2 *
                    (Y[lVar2 * 2 + 2] + X[lVar2 * 2 + 2] + X[lVar2 * 2 + 3] + Y[lVar2 * 2 + 3]);
  }
  return uVar1;
}

Assistant:

static uint32_t ExtraCostCombined_C(const uint32_t* WEBP_RESTRICT X,
                                    const uint32_t* WEBP_RESTRICT Y,
                                    int length) {
  int i;
  uint32_t cost = X[4] + Y[4] + X[5] + Y[5];
  assert(length % 2 == 0);
  for (i = 2; i < length / 2 - 1; ++i) {
    const int xy0 = X[2 * i + 2] + Y[2 * i + 2];
    const int xy1 = X[2 * i + 3] + Y[2 * i + 3];
    cost += i * (xy0 + xy1);
  }
  return cost;
}